

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalStructuralDominance.cpp
# Opt level: O1

void wasm::LocalStructuralDominance::LocalStructuralDominance(wasm::Function*,wasm::Module&,wasm::
     LocalStructuralDominance::Mode)::Scanner::doEndScope(Scanner*,wasm::Expression___
               (Scanner *self,Expression **currp)

{
  uint uVar1;
  pointer pSVar2;
  _Bit_type *p_Var3;
  ulong uVar4;
  pointer puVar5;
  array<unsigned_int,_5UL> *paVar6;
  ulong uVar7;
  array<unsigned_int,_5UL> *paVar8;
  long lVar9;
  ulong uVar10;
  
  pSVar2 = (self->cleanupStack).
           super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = ((long)pSVar2[-1].flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)pSVar2[-1].flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) + pSVar2[-1].usedFixed;
  if (uVar7 != 0) {
    paVar8 = &pSVar2[-1].fixed;
    p_Var3 = (self->localsSet).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar9 = -0x14;
    uVar10 = 0;
    do {
      paVar6 = (array<unsigned_int,_5UL> *)
               ((long)pSVar2[-1].flexible.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9);
      if (uVar10 < 5) {
        paVar6 = paVar8;
      }
      uVar1 = paVar6->_M_elems[0];
      uVar4 = p_Var3[uVar1 >> 6];
      if ((uVar4 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        __assert_fail("self->localsSet[index]",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalStructuralDominance.cpp"
                      ,0x6f,
                      "static void wasm::LocalStructuralDominance::LocalStructuralDominance(Function *, Module &, Mode)::Scanner::doEndScope(Scanner *, Expression **)"
                     );
      }
      p_Var3[uVar1 >> 6] = uVar4 & ~(1L << ((byte)uVar1 & 0x3f));
      uVar10 = uVar10 + 1;
      paVar8 = (array<unsigned_int,_5UL> *)(paVar8->_M_elems + 1);
      lVar9 = lVar9 + 4;
    } while (uVar7 != uVar10);
  }
  (self->cleanupStack).
  super__Vector_base<wasm::SmallVector<unsigned_int,_5UL>,_std::allocator<wasm::SmallVector<unsigned_int,_5UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar2 + -1;
  puVar5 = pSVar2[-1].flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (pointer)0x0) {
    operator_delete(puVar5,(long)pSVar2[-1].flexible.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar5);
    return;
  }
  return;
}

Assistant:

static void doEndScope(Scanner* self, Expression** currp) {
      for (auto index : self->cleanupStack.back()) {
        assert(self->localsSet[index]);
        self->localsSet[index] = false;
      }
      self->cleanupStack.pop_back();
    }